

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O3

FT_UInt32 pfr_cmap_char_next(PFR_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  FT_UInt32 FVar6;
  uint uVar7;
  
  uVar1 = cmap->num_chars;
  if (uVar1 == 0) {
LAB_001484b5:
    FVar6 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = *pchar_code;
    do {
      uVar5 = uVar5 + 1;
      uVar4 = 0;
      uVar7 = uVar1;
      while( true ) {
        uVar3 = (uVar7 - uVar4 >> 1) + uVar4;
        uVar2 = cmap->chars[uVar3].char_code;
        if (uVar2 == uVar5) break;
        if (uVar2 < uVar5) {
          uVar4 = uVar3 + 1;
          uVar3 = uVar7;
        }
        uVar7 = uVar3;
        if (uVar7 <= uVar4) {
          if (uVar4 == 0 || uVar1 <= uVar4) goto LAB_001484b5;
          FVar6 = uVar4 + 1;
          uVar5 = cmap->chars[uVar4].char_code;
          goto LAB_001484cf;
        }
      }
    } while (uVar3 == 0);
    FVar6 = uVar3 + 1;
  }
LAB_001484cf:
  *pchar_code = uVar5;
  return FVar6;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  pfr_cmap_char_next( PFR_CMap    cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;


  Restart:
    {
      FT_UInt   min = 0;
      FT_UInt   max = cmap->num_chars;
      FT_UInt   mid;
      PFR_Char  gchar;


      while ( min < max )
      {
        mid   = min + ( ( max - min ) >> 1 );
        gchar = cmap->chars + mid;

        if ( gchar->char_code == char_code )
        {
          result = mid;
          if ( result != 0 )
          {
            result++;
            goto Exit;
          }

          char_code++;
          goto Restart;
        }

        if ( gchar->char_code < char_code )
          min = mid + 1;
        else
          max = mid;
      }

      /* we didn't find it, but we have a pair just above it */
      char_code = 0;

      if ( min < cmap->num_chars )
      {
        gchar  = cmap->chars + min;
        result = min;
        if ( result != 0 )
        {
          result++;
          char_code = gchar->char_code;
        }
      }
    }

  Exit:
    *pchar_code = char_code;
    return result;
  }